

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::(anonymous_namespace)::
ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test::
~ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test
          (ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test *this)

{
  *(undefined ***)this = &PTR__TwoDimensionalQpTest_00203748;
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)(this + 0x10));
  testing::Test::~Test((Test *)this);
  operator_delete(this + -8,0x20);
  return;
}

Assistant:

TEST_P(ParameterizedTwoDimensionalQpTest,
       SolvesWithNewObjectiveAndConstraintMatrices) {
  // Minimize x^2 + (1/2)xy + y^2 subject to x >= 1.
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);

  double x_exp = 1.0;
  double y_exp = -0.25;

  EXPECT_NEAR(solver_.objective_value(),
              x_exp * x_exp + 0.5 * x_exp * y_exp + y_exp * y_exp,
              2 * kTolerance);
  ExpectElementsAre(solver_.primal_solution(), {x_exp, y_exp}, kTolerance);
  ExpectElementsAre(solver_.dual_solution(), {-15.0 / 8.0}, 2 * kTolerance);

  // Change to minimize x^2 + (1/2)xy + (1/2)y^2 subject to 0.5*x >= 1.
  SparseMatrix<double> new_objective_matrix(2, 2);
  const Triplet<double> kTripletsP[] = {
      {0, 0, 2.0}, {1, 0, 0.5}, {0, 1, 0.5}, {1, 1, 1}};
  new_objective_matrix.setFromTriplets(std::begin(kTripletsP),
                                       std::end(kTripletsP));
  if (GetParam()) {
    new_objective_matrix = new_objective_matrix.triangularView<Eigen::Upper>();
  }

  SparseMatrix<double> new_constraint_matrix(1, 2);
  const Triplet<double> kTripletsA[] = {{0, 0, 0.5}};
  new_constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                        std::end(kTripletsA));

  const absl::Status result = solver_.UpdateObjectiveAndConstraintMatrices(
      new_objective_matrix, new_constraint_matrix);
  ASSERT_TRUE(result.ok());
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);

  x_exp = 2.0;
  y_exp = -1.0;
  EXPECT_NEAR(solver_.objective_value(),
              x_exp * x_exp + 0.5 * x_exp * y_exp + 0.5 * y_exp * y_exp,
              2 * kTolerance);
  ExpectElementsAre(solver_.primal_solution(), {x_exp, y_exp}, kTolerance);
}